

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O2

void __thiscall
QParallelAnimationGroupPrivate::disconnectUncontrolledAnimations
          (QParallelAnimationGroupPrivate *this)

{
  Span *pSVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  piter local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = (piter)QHash<QAbstractAnimation_*,_int>::constBegin(&this->uncontrolledFinishTime);
  while( true ) {
    if (local_30.d == (Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> *)0x0 &&
        local_30.bucket == 0) break;
    pSVar1 = (local_30.d)->spans;
    uVar2 = local_30.bucket >> 7;
    QAnimationGroupPrivate::disconnectUncontrolledAnimation
              (&this->super_QAnimationGroupPrivate,
               *(QAbstractAnimation **)
                pSVar1[uVar2].entries[pSVar1[uVar2].offsets[(uint)local_30.bucket & 0x7f]].storage.
                data);
    QHashPrivate::iterator<QHashPrivate::Node<QAbstractAnimation_*,_int>_>::operator++(&local_30);
  }
  QHash<QAbstractAnimation_*,_int>::clear(&this->uncontrolledFinishTime);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QParallelAnimationGroupPrivate::disconnectUncontrolledAnimations()
{
    for (AnimationTimeHashConstIt it = uncontrolledFinishTime.constBegin(), cend = uncontrolledFinishTime.constEnd(); it != cend; ++it)
        disconnectUncontrolledAnimation(it.key());

    uncontrolledFinishTime.clear();
}